

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O2

void __thiscall QLearning::QLearning(QLearning *this,int *s,int *r,int *a)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  undefined4 *puVar3;
  
  this->_stateSize = *s;
  this->_actionSize = *a + 1;
  this->_range = *r;
  (this->_actionRange).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_actionRange).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_actionRange).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->_q_table)._M_t._M_impl.super__Rb_tree_header;
  (this->_q_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_q_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_q_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_q_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_q_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((0 < *s) && (0 < *a)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Constructor call successful");
    std::endl<char,std::char_traits<char>>(poVar2);
    QtableLogic(this,this->_range,this->_stateSize,this->_actionSize);
    poVar2 = std::operator<<((ostream *)&std::cout,"Q table generated successfully successful");
    std::endl<char,std::char_traits<char>>(poVar2);
    this->_init = true;
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0xffffffff;
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

QLearning::QLearning(const int &s, const int &r, const int &a) : _stateSize(s), _range(r), _actionSize(a + 1)
{
    try
    {
        if (s > 0 && a > 0)
        {
            std::cout << "Constructor call successful" << std::endl;
            QtableLogic(_range, _stateSize, _actionSize);
            std::cout << "Q table generated successfully successful" << std::endl;
            _init = true;
        }
        else
        {
            throw -1;
        }
    }
    catch (...)
    {
        std::cerr << "State or action size is 0" << std::endl;
    }
}